

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::generateTimeBarrier(CoreBroker *this,ActionMessage *message)

{
  BaseType BVar1;
  ActionMessage cancelBarrier;
  ActionMessage AStack_c8;
  
  if ((message->flags & 0x2000) == 0) {
    ActionMessage::setAction(message,cmd_time_barrier);
    BVar1 = (this->super_BrokerBase).global_broker_id_local.gid;
    (message->source_id).gid = BVar1;
    if (message->messageID == 0) {
      message->messageID = BVar1;
    }
    (this->mNextTimeBarrier).internalTimeCode = (message->actionTime).internalTimeCode;
    broadcast(this,message);
    return;
  }
  ActionMessage::ActionMessage(&AStack_c8,cmd_time_barrier_clear);
  AStack_c8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  if (AStack_c8.messageID == 0) {
    AStack_c8.messageID = AStack_c8.source_id.gid;
  }
  (this->mNextTimeBarrier).internalTimeCode = 0x7fffffffffffffff;
  broadcast(this,&AStack_c8);
  ActionMessage::~ActionMessage(&AStack_c8);
  return;
}

Assistant:

void CoreBroker::generateTimeBarrier(ActionMessage& message)
{
    if (checkActionFlag(message, cancel_flag)) {
        ActionMessage cancelBarrier(CMD_TIME_BARRIER_CLEAR);
        cancelBarrier.source_id = global_broker_id_local;
        if (cancelBarrier.messageID == 0) {
            cancelBarrier.messageID = global_broker_id_local.baseValue();
        }
        mNextTimeBarrier = Time::maxVal();
        broadcast(cancelBarrier);
        return;
    }
    message.setAction(CMD_TIME_BARRIER);
    message.source_id = global_broker_id_local;
    if (message.messageID == 0) {
        message.messageID = global_broker_id_local.baseValue();
    }
    mNextTimeBarrier = message.actionTime;
    // time should already be set
    broadcast(message);
}